

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

void y4m_convert_444_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *in_RDX;
  int *in_RDI;
  int x;
  int y;
  int pli;
  int tmp_sz;
  int dst_c_sz;
  int dst_c_h;
  int dst_c_w;
  int c_sz;
  int c_h;
  int c_w;
  uchar *tmp;
  byte local_1f0;
  int local_1ec;
  int local_1d4;
  byte local_1c0;
  int local_1bc;
  int local_1a4;
  int local_18c;
  int local_174;
  int local_160;
  int local_15c;
  int local_144;
  byte local_130;
  byte local_12c;
  int local_128;
  byte local_124;
  int local_120;
  int local_110;
  int local_100;
  byte local_ec;
  int local_e8;
  int local_d8;
  byte *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  byte *in_stack_ffffffffffffff40;
  int local_b8;
  int local_a8;
  int local_98;
  int local_84;
  int local_80;
  int local_70;
  int local_60;
  int local_50;
  int local_48;
  int local_44;
  int local_40;
  byte *local_20;
  byte *local_18;
  
  iVar2 = (*in_RDI + in_RDI[7] + -1) / in_RDI[7];
  iVar1 = in_RDI[1];
  iVar3 = (*in_RDI + in_RDI[9] + -1) / in_RDI[9];
  local_20 = in_RDX + iVar2 * iVar1 * 2;
  local_18 = in_RDX;
  for (local_40 = 1; local_40 < 3; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < iVar1; local_44 = local_44 + 1) {
      local_48 = 0;
      while( true ) {
        local_50 = iVar2;
        if (2 < iVar2) {
          local_50 = 2;
        }
        if (local_50 <= local_48) break;
        if (iVar2 + -1 < 1) {
          local_60 = iVar2 + -1;
        }
        else {
          local_60 = 1;
        }
        if (iVar2 + -1 < 2) {
          local_70 = iVar2 + -1;
        }
        else {
          local_70 = 2;
        }
        if (iVar2 + -1 < 3) {
          local_80 = iVar2 + -1;
        }
        else {
          local_80 = 3;
        }
        if ((int)((uint)*local_18 * 0x40 + (uint)local_18[local_60] * 0x4e +
                  (uint)local_18[local_70] * -0x11 + (uint)local_18[local_80] * 3 + 0x40) >> 7 <
            0x100) {
          if (iVar2 + -1 < 1) {
            local_98 = iVar2 + -1;
          }
          else {
            local_98 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_a8 = iVar2 + -1;
          }
          else {
            local_a8 = 2;
          }
          if (iVar2 + -1 < 3) {
            local_b8 = iVar2 + -1;
          }
          else {
            local_b8 = 3;
          }
          local_84 = (int)((uint)*local_18 * 0x40 + (uint)local_18[local_98] * 0x4e +
                           (uint)local_18[local_a8] * -0x11 + (uint)local_18[local_b8] * 3 + 0x40)
                     >> 7;
        }
        else {
          local_84 = 0xff;
        }
        if (local_84 < 1) {
          local_124 = 0;
        }
        else {
          in_stack_ffffffffffffff3c = (uint)*local_18 * 0x40;
          if (iVar2 + -1 < 1) {
            in_stack_ffffffffffffff38 = iVar2 + -1;
          }
          else {
            in_stack_ffffffffffffff38 = 1;
          }
          if (iVar2 + -1 < 2) {
            local_d8 = iVar2 + -1;
          }
          else {
            local_d8 = 2;
          }
          if (iVar2 + -1 < 3) {
            local_e8 = iVar2 + -1;
          }
          else {
            local_e8 = 3;
          }
          if ((int)(in_stack_ffffffffffffff3c + (uint)local_18[in_stack_ffffffffffffff38] * 0x4e +
                    (uint)local_18[local_d8] * -0x11 + (uint)local_18[local_e8] * 3 + 0x40) >> 7 <
              0x100) {
            if (iVar2 + -1 < 1) {
              local_100 = iVar2 + -1;
            }
            else {
              local_100 = 1;
            }
            if (iVar2 + -1 < 2) {
              local_110 = iVar2 + -1;
            }
            else {
              local_110 = 2;
            }
            if (iVar2 + -1 < 3) {
              local_120 = iVar2 + -1;
            }
            else {
              local_120 = 3;
            }
            local_ec = (byte)((int)((uint)*local_18 * 0x40 + (uint)local_18[local_100] * 0x4e +
                                    (uint)local_18[local_110] * -0x11 +
                                    (uint)local_18[local_120] * 3 + 0x40) >> 7);
          }
          else {
            local_ec = 0xff;
          }
          local_124 = local_ec;
          in_stack_ffffffffffffff30 = local_18;
          in_stack_ffffffffffffff40 = local_18;
        }
        local_20[local_48 >> 1] = local_124;
        local_48 = local_48 + 2;
      }
      for (; local_48 < iVar2 + -3; local_48 = local_48 + 2) {
        if ((int)(((uint)local_18[local_48 + -2] + (uint)local_18[local_48 + 3]) * 3 +
                  ((uint)local_18[local_48 + -1] + (uint)local_18[local_48 + 2]) * -0x11 +
                  ((uint)local_18[local_48] + (uint)local_18[local_48 + 1]) * 0x4e + 0x40) >> 7 <
            0x100) {
          local_128 = (int)(((uint)local_18[local_48 + -2] + (uint)local_18[local_48 + 3]) * 3 +
                            ((uint)local_18[local_48 + -1] + (uint)local_18[local_48 + 2]) * -0x11 +
                            ((uint)local_18[local_48] + (uint)local_18[local_48 + 1]) * 0x4e + 0x40)
                      >> 7;
        }
        else {
          local_128 = 0xff;
        }
        if (local_128 < 1) {
          local_130 = 0;
        }
        else {
          if ((int)(((uint)local_18[local_48 + -2] + (uint)local_18[local_48 + 3]) * 3 +
                    ((uint)local_18[local_48 + -1] + (uint)local_18[local_48 + 2]) * -0x11 +
                    ((uint)local_18[local_48] + (uint)local_18[local_48 + 1]) * 0x4e + 0x40) >> 7 <
              0x100) {
            local_12c = (byte)((int)(((uint)local_18[local_48 + -2] + (uint)local_18[local_48 + 3])
                                     * 3 + ((uint)local_18[local_48 + -1] +
                                           (uint)local_18[local_48 + 2]) * -0x11 +
                                     ((uint)local_18[local_48] + (uint)local_18[local_48 + 1]) *
                                     0x4e + 0x40) >> 7);
          }
          else {
            local_12c = 0xff;
          }
          local_130 = local_12c;
        }
        local_20[local_48 >> 1] = local_130;
      }
      for (; local_48 < iVar2; local_48 = local_48 + 2) {
        if (iVar2 + -1 < local_48 + 2) {
          local_144 = iVar2 + -1;
        }
        else {
          local_144 = local_48 + 2;
        }
        if (iVar2 + -1 < local_48 + 1) {
          local_15c = iVar2 + -1;
        }
        else {
          local_15c = local_48 + 1;
        }
        if ((int)(((uint)local_18[local_48 + -2] + (uint)local_18[iVar2 + -1]) * 3 +
                  ((uint)local_18[local_48 + -1] + (uint)local_18[local_144]) * -0x11 +
                  ((uint)local_18[local_48] + (uint)local_18[local_15c]) * 0x4e + 0x40) >> 7 < 0x100
           ) {
          if (iVar2 + -1 < local_48 + 2) {
            local_174 = iVar2 + -1;
          }
          else {
            local_174 = local_48 + 2;
          }
          if (iVar2 + -1 < local_48 + 1) {
            local_18c = iVar2 + -1;
          }
          else {
            local_18c = local_48 + 1;
          }
          local_160 = (int)(((uint)local_18[local_48 + -2] + (uint)local_18[iVar2 + -1]) * 3 +
                            ((uint)local_18[local_48 + -1] + (uint)local_18[local_174]) * -0x11 +
                            ((uint)local_18[local_48] + (uint)local_18[local_18c]) * 0x4e + 0x40) >>
                      7;
        }
        else {
          local_160 = 0xff;
        }
        if (local_160 < 1) {
          local_1f0 = 0;
        }
        else {
          if (iVar2 + -1 < local_48 + 2) {
            local_1a4 = iVar2 + -1;
          }
          else {
            local_1a4 = local_48 + 2;
          }
          if (iVar2 + -1 < local_48 + 1) {
            local_1bc = iVar2 + -1;
          }
          else {
            local_1bc = local_48 + 1;
          }
          if ((int)(((uint)local_18[local_48 + -2] + (uint)local_18[iVar2 + -1]) * 3 +
                    ((uint)local_18[local_48 + -1] + (uint)local_18[local_1a4]) * -0x11 +
                    ((uint)local_18[local_48] + (uint)local_18[local_1bc]) * 0x4e + 0x40) >> 7 <
              0x100) {
            if (iVar2 + -1 < local_48 + 2) {
              local_1d4 = iVar2 + -1;
            }
            else {
              local_1d4 = local_48 + 2;
            }
            if (iVar2 + -1 < local_48 + 1) {
              local_1ec = iVar2 + -1;
            }
            else {
              local_1ec = local_48 + 1;
            }
            local_1c0 = (byte)((int)(((uint)local_18[local_48 + -2] + (uint)local_18[iVar2 + -1]) *
                                     3 + ((uint)local_18[local_48 + -1] + (uint)local_18[local_1d4])
                                         * -0x11 +
                                     ((uint)local_18[local_48] + (uint)local_18[local_1ec]) * 0x4e +
                                    0x40) >> 7);
          }
          else {
            local_1c0 = 0xff;
          }
          local_1f0 = local_1c0;
        }
        local_20[local_48 >> 1] = local_1f0;
      }
      local_20 = local_20 + iVar3;
      local_18 = local_18 + iVar2;
    }
    local_20 = local_20 + -(long)(iVar3 * iVar1);
    y4m_422jpeg_420jpeg_helper
              (in_stack_ffffffffffffff40,
               (uchar *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

static void y4m_convert_444_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
    for (y = 0; y < c_h; y++) {
      for (x = 0; x < OC_MINI(c_w, 2); x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (64 * _aux[0] + 78 * _aux[OC_MINI(1, c_w - 1)] -
                                 17 * _aux[OC_MINI(2, c_w - 1)] +
                                 3 * _aux[OC_MINI(3, c_w - 1)] + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w - 3; x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (3 * (_aux[x - 2] + _aux[x + 3]) -
                                 17 * (_aux[x - 1] + _aux[x + 2]) +
                                 78 * (_aux[x] + _aux[x + 1]) + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w; x += 2) {
        tmp[x >> 1] =
            OC_CLAMPI(0,
                      (3 * (_aux[x - 2] + _aux[c_w - 1]) -
                       17 * (_aux[x - 1] + _aux[OC_MINI(x + 2, c_w - 1)]) +
                       78 * (_aux[x] + _aux[OC_MINI(x + 1, c_w - 1)]) + 64) >>
                          7,
                      255);
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}